

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass.cpp
# Opt level: O2

void __thiscall
wasm::PassRegistry::registerPass(PassRegistry *this,char *name,char *description,Creator *create)

{
  iterator iVar1;
  mapped_type *this_00;
  PassInfo local_d8;
  string local_90;
  function<wasm::Pass_*()> local_70;
  key_type local_50;
  allocator<char> local_2a;
  allocator<char> local_29;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d8,name,(allocator<char> *)&local_50);
  iVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wasm::PassRegistry::PassInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wasm::PassRegistry::PassInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wasm::PassRegistry::PassInfo>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wasm::PassRegistry::PassInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wasm::PassRegistry::PassInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wasm::PassRegistry::PassInfo>_>_>
                  *)this,&local_d8.description);
  if ((_Rb_tree_header *)iVar1._M_node == &(this->passInfos)._M_t._M_impl.super__Rb_tree_header) {
    std::__cxx11::string::~string((string *)&local_d8);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,description,&local_2a);
    std::function<wasm::Pass_*()>::function(&local_70,create);
    PassInfo::PassInfo(&local_d8,&local_90,&local_70,false);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,name,&local_29);
    this_00 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wasm::PassRegistry::PassInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wasm::PassRegistry::PassInfo>_>_>
              ::operator[](&this->passInfos,&local_50);
    PassInfo::operator=(this_00,&local_d8);
    std::__cxx11::string::~string((string *)&local_50);
    PassInfo::~PassInfo(&local_d8);
    std::_Function_base::~_Function_base(&local_70.super__Function_base);
    std::__cxx11::string::~string((string *)&local_90);
    return;
  }
  __assert_fail("passInfos.find(name) == passInfos.end()",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/pass.cpp"
                ,0x2f,"void wasm::PassRegistry::registerPass(const char *, const char *, Creator)");
}

Assistant:

void PassRegistry::registerPass(const char* name,
                                const char* description,
                                Creator create) {
  assert(passInfos.find(name) == passInfos.end());
  passInfos[name] = PassInfo(description, create);
}